

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::Exception::Detail>::setCapacity(Vector<kj::Exception::Detail> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::Exception::Detail> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::Exception::Detail> newBuilder;
  size_t newSize_local;
  Vector<kj::Exception::Detail> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::Exception::Detail>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::Exception::Detail>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::Exception::Detail>
            ((ArrayBuilder<kj::Exception::Detail> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::Exception::Detail>>(&this->builder);
  ArrayBuilder<kj::Exception::Detail>::addAll<kj::ArrayBuilder<kj::Exception::Detail>>
            ((ArrayBuilder<kj::Exception::Detail> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::Exception::Detail>>
                     ((ArrayBuilder<kj::Exception::Detail> *)local_38);
  ArrayBuilder<kj::Exception::Detail>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::Exception::Detail>::~ArrayBuilder
            ((ArrayBuilder<kj::Exception::Detail> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }